

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool __thiscall
llama_model_loader::get_key<std::__cxx11::string>
          (llama_model_loader *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result,bool required)

{
  bool bVar1;
  pointer ppVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  byte in_CL;
  string *in_RDI;
  bool found;
  llama_model_kv_override *override;
  iterator it;
  llama_model_kv_override *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string local_60 [39];
  undefined1 local_39;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_true>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_true>
  local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x45a4bf);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::__detail::operator!=(&local_28,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_false,_true>
                           *)0x45a4f9);
    target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppVar2->second;
  }
  else {
    target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  local_30 = target;
  std::unique_ptr<gguf_context,_gguf_context_deleter>::get
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)target);
  local_39 = GGUFMeta::
             GKV<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
             set((gguf_context *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_RDI,target,in_stack_ffffffffffffff78);
  if (((local_19 & 1) != 0) && (!(bool)local_39)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar3 = std::__cxx11::string::c_str();
    format_abi_cxx11_((char *)local_60,"key not found in model: %s",uVar3);
    std::runtime_error::runtime_error(this_00,local_60);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (bool)local_39;
}

Assistant:

bool llama_model_loader::get_key(const std::string & key, T & result, bool required) {
        auto it = kv_overrides.find(key);

        const struct llama_model_kv_override * override =
            it != kv_overrides.end() ? &it->second : nullptr;

        const bool found = GGUFMeta::GKV<T>::set(meta.get(), key, result, override);

        if (required && !found) {
            throw std::runtime_error(format("key not found in model: %s", key.c_str()));
        }

        return found;
    }